

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O0

Array __thiscall notch::pre::SquareAugmented::apply(SquareAugmented *this,Array *input)

{
  float fVar1;
  float *pfVar2;
  valarray<float> *in_RDX;
  float *extraout_RDX;
  Array AVar3;
  float *pfStack_50;
  float x;
  float *outSquare;
  float *out;
  float *inEnd;
  float *in;
  size_t local_28;
  size_t n;
  Array *input_local;
  SquareAugmented *this_local;
  Array *output;
  
  n = (size_t)in_RDX;
  input_local = input;
  this_local = this;
  local_28 = core::std::valarray<float>::size(in_RDX);
  in._7_1_ = 0;
  in._0_4_ = 0;
  core::std::valarray<float>::valarray((valarray<float> *)this,(float *)&in,local_28 << 1);
  inEnd = core::std::begin<float>((valarray<float> *)n);
  pfVar2 = core::std::end<float>((valarray<float> *)n);
  outSquare = core::std::begin<float>((valarray<float> *)this);
  pfStack_50 = outSquare + local_28;
  for (; inEnd != pfVar2; inEnd = inEnd + 1) {
    fVar1 = *inEnd;
    *outSquare = fVar1;
    *pfStack_50 = fVar1 * fVar1;
    outSquare = outSquare + 1;
    pfStack_50 = pfStack_50 + 1;
  }
  AVar3._M_data = extraout_RDX;
  AVar3._M_size = (size_t)this;
  return AVar3;
}

Assistant:

virtual Array apply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, 2 * n);
        auto in = std::begin(input);
        auto inEnd = std::end(input);
        auto out = std::begin(output);
        auto outSquare = out + n;
        for (; in != inEnd; ++in, ++out, ++outSquare) {
            float x = *in;
            *out = x;
            *outSquare = x * x;
        }
        return output;
    }